

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::saveSettingsFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,char *filename,bool onlyChanged,int solvemode)

{
  byte *pbVar1;
  double dVar2;
  int iVar3;
  ostream *poVar4;
  ulong uVar5;
  long lVar6;
  char *pcVar7;
  int i;
  long lVar8;
  ofstream file;
  long local_230;
  filebuf local_228 [16];
  uint auStack_218 [56];
  ios_base local_138 [264];
  
  std::ofstream::ofstream(&local_230,filename,_S_out);
  *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 0x10;
  *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
  iVar3 = *(int *)((long)auStack_218 + *(long *)(local_230 + -0x18) + 8);
  if (iVar3 == 0) {
    pbVar1 = (byte *)((long)auStack_218 + *(long *)(local_230 + -0x18));
    *pbVar1 = *pbVar1 | 0x20;
    *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 8;
    *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 4;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_230,"# SoPlexBase version ",0x15);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)&local_230,8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,".",1);
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    lVar6 = -0x340;
    lVar8 = 0;
    do {
      if ((!onlyChanged) ||
         (this->_currentSettings->_boolParamValues[lVar8] != (bool)(&DAT_006b85e8)[lVar8])) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,*(char **)(&DAT_006b85e8 + lVar6),
                            *(long *)(lVar6 + 0x6b85f0));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,"# range {true, false}, default ",0x1f);
        pcVar7 = "false\n";
        if ((ulong)(byte)(&DAT_006b85e8)[lVar8] != 0) {
          pcVar7 = "true\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&local_230,pcVar7,6 - (ulong)(byte)(&DAT_006b85e8)[lVar8]);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"bool:",5);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,*(char **)((long)&DAT_006b82a8 + lVar6),
                            *(long *)((long)&DAT_006b82b0 + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        uVar5 = (ulong)this->_currentSettings->_boolParamValues[lVar8];
        pcVar7 = "false\n";
        if (uVar5 != 0) {
          pcVar7 = "true\n";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar7,6 - uVar5);
      }
      lVar8 = lVar8 + 1;
      lVar6 = lVar6 + 0x20;
    } while (lVar6 != 0);
    lVar6 = 0;
    do {
      if ((!onlyChanged) ||
         (*(int *)((long)this->_currentSettings->_intParamValues + lVar6) !=
          *(int *)((long)&DAT_006b8d10 + lVar6))) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,(char *)(&DAT_006b8990)[lVar6],
                            (&DAT_006b8998)[lVar6]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# range [",9);
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&local_230,*(int *)((long)&DAT_006b8d80 + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        poVar4 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar4,*(int *)((long)&DAT_006b8df0 + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"], default ",0xb);
        poVar4 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar4,*(int *)((long)&DAT_006b8d10 + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"int:",4);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,
                            (char *)(&SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                      ::Settings::intParam)[lVar6],(&DAT_006b8618)[lVar6]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)poVar4,
                            *(int *)((long)this->_currentSettings->_intParamValues + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      lVar6 = lVar6 + 4;
    } while (lVar6 != 0x70);
    *(undefined8 *)(local_228 + *(long *)(local_230 + -0x18)) = 8;
    *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)(local_230 + -0x18)) & 0xfffffefb | 0x100;
    lVar6 = 0;
    do {
      if (onlyChanged) {
        dVar2 = *(double *)((long)this->_currentSettings->_realParamValues + lVar6);
        if ((dVar2 != *(double *)((long)&DAT_006b9528 + lVar6)) ||
           (NAN(dVar2) || NAN(*(double *)((long)&DAT_006b9528 + lVar6)))) goto LAB_0033c89e;
      }
      else {
LAB_0033c89e:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# ",2);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,*(char **)((long)&DAT_006b91c8 + lVar6 * 4),
                            *(long *)((long)&DAT_006b91d0 + lVar6 * 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# range [",9);
        poVar4 = std::ostream::_M_insert<double>(*(double *)((long)&DAT_006b9600 + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,",",1);
        poVar4 = std::ostream::_M_insert<double>(*(double *)((long)&DAT_006b96d8 + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"], default ",0xb);
        poVar4 = std::ostream::_M_insert<double>(*(double *)((long)&DAT_006b9528 + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"real:",5);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_230,
                            *(char **)((long)&SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                                              ::Settings::realParam + lVar6 * 4),
                            *(long *)((long)&DAT_006b8e70 + lVar6 * 4));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," = ",3);
        poVar4 = std::ostream::_M_insert<double>
                           (*(double *)((long)this->_currentSettings->_realParamValues + lVar6));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      }
      lVar6 = lVar6 + 8;
    } while (lVar6 != 0xd8);
    if ((!onlyChanged) || ((this->_solver).random.seedshift != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"# initial random seed used for perturbation\n",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_230,"# range [0, ",0xc);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"], default ",0xb);
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_230,"uint:random_seed = ",0x13);
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&local_230);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
    }
  }
  local_230 = _VTT;
  *(undefined8 *)(local_228 + *(long *)(_VTT + -0x18) + -8) = _sqrt;
  std::filebuf::~filebuf(local_228);
  std::ios_base::~ios_base(local_138);
  return iVar3 == 0;
}

Assistant:

bool SoPlexBase<R>::saveSettingsFile(const char* filename, const bool onlyChanged,
                                     int solvemode) const
{
   assert(filename != nullptr);

   std::ofstream file(filename);
   SPxOut::setScientific(file, 16);

   if(!file.good())
      return false;

   file.setf(std::ios::left);

   SPxOut::setFixed(file);

   file << "# SoPlexBase version " << SOPLEX_VERSION / 100 << "." << (SOPLEX_VERSION / 10) % 10 << "."
        << SOPLEX_VERSION % 10 << "\n";

   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_boolParamValues[i] == _currentSettings->boolParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->boolParam.description[i] << "\n";
      file << "# range {true, false}, default " << (_currentSettings->boolParam.defaultValue[i] ?
            "true\n" : "false\n");
      file << "bool:" << _currentSettings->boolParam.name[i] << " = " <<
           (_currentSettings->_boolParamValues[i] ? "true\n" : "false\n");
   }

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_intParamValues[i] == _currentSettings->intParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->intParam.description[i] << "\n";
      file << "# range [" << _currentSettings->intParam.lower[i] << "," <<
           _currentSettings->intParam.upper[i]
           << "], default " << _currentSettings->intParam.defaultValue[i] << "\n";
      file << "int:" << _currentSettings->intParam.name[i] << " = " <<
           _currentSettings->_intParamValues[i] << "\n";
   }

   SPxOut::setScientific(file);

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_realParamValues[i] == _currentSettings->realParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->realParam.description[i] << "\n";
      file << "# range [" << _currentSettings->realParam.lower[i] << "," <<
           _currentSettings->realParam.upper[i]
           << "], default " << _currentSettings->realParam.defaultValue[i] << "\n";
      file << "real:" << _currentSettings->realParam.name[i] << " = " <<
           _currentSettings->_realParamValues[i] << "\n";
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_rationalParamValues[i] == _currentSettings->rationalParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->rationalParam.description[i] << "\n";
      file << "# range [" << _currentSettings->rationalParam.lower[i] << "," <<
           _currentSettings->rationalParam.upper[i]
           << "], default " << _currentSettings->rationalParam.defaultValue[i] << "\n";
      file << "rational:" << _currentSettings->rationalParam.name[i] << " = " <<
           _currentSettings->_rationalParamValues[i] << "\n";
   }

#endif

   if(!onlyChanged || _solver.random.getSeed() != SOPLEX_DEFAULT_RANDOM_SEED)
   {
      file << "\n";
      file << "# initial random seed used for perturbation\n";
      file << "# range [0, " << UINT_MAX << "], default " << SOPLEX_DEFAULT_RANDOM_SEED << "\n";
      file << "uint:random_seed = " << _solver.random.getSeed() << "\n";
   }

   return true;
}